

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O2

int get_model_rd_index_for_pruning(MACROBLOCK *x,INTRA_MODE_SPEED_FEATURES *intra_sf)

{
  PREDICTION_MODE PVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  
  iVar2 = intra_sf->top_intra_model_count_allowed;
  if (intra_sf->adapt_top_model_rd_count_using_neighbors == 0) {
    return iVar2 + -1;
  }
  PVar1 = (*(x->e_mbd).mi)->mode;
  if ((x->e_mbd).left_available == true) {
    bVar4 = ((x->e_mbd).left_mbmi)->mode != PVar1;
  }
  else {
    bVar4 = false;
  }
  if ((x->e_mbd).up_available == true) {
    bVar5 = ((x->e_mbd).above_mbmi)->mode != PVar1;
  }
  else {
    bVar5 = false;
  }
  if (x->qindex < 0x80) {
    bVar4 = (bool)(bVar4 | bVar5);
  }
  else {
    bVar4 = (bool)(bVar4 & bVar5);
  }
  if (bVar4) {
    iVar3 = 2;
    if (2 < iVar2) {
      iVar3 = iVar2;
    }
    return iVar3 + -2;
  }
  return iVar2 + -1;
}

Assistant:

static inline int get_model_rd_index_for_pruning(
    const MACROBLOCK *const x,
    const INTRA_MODE_SPEED_FEATURES *const intra_sf) {
  const int top_intra_model_count_allowed =
      intra_sf->top_intra_model_count_allowed;
  if (!intra_sf->adapt_top_model_rd_count_using_neighbors)
    return top_intra_model_count_allowed - 1;

  const MACROBLOCKD *const xd = &x->e_mbd;
  const PREDICTION_MODE mode = xd->mi[0]->mode;
  int model_rd_index_for_pruning = top_intra_model_count_allowed - 1;
  int is_left_mode_neq_cur_mode = 0, is_above_mode_neq_cur_mode = 0;
  if (xd->left_available)
    is_left_mode_neq_cur_mode = xd->left_mbmi->mode != mode;
  if (xd->up_available)
    is_above_mode_neq_cur_mode = xd->above_mbmi->mode != mode;
  // The pruning of luma intra modes is made more aggressive at lower quantizers
  // and vice versa. The value for model_rd_index_for_pruning is derived as
  // follows.
  // qidx 0 to 127: Reduce the index of a candidate used for comparison only if
  // the current mode does not match either of the available neighboring modes.
  // qidx 128 to 255: Reduce the index of a candidate used for comparison only
  // if the current mode does not match both the available neighboring modes.
  if (x->qindex <= 127) {
    if (is_left_mode_neq_cur_mode || is_above_mode_neq_cur_mode)
      model_rd_index_for_pruning = AOMMAX(model_rd_index_for_pruning - 1, 0);
  } else {
    if (is_left_mode_neq_cur_mode && is_above_mode_neq_cur_mode)
      model_rd_index_for_pruning = AOMMAX(model_rd_index_for_pruning - 1, 0);
  }
  return model_rd_index_for_pruning;
}